

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *args_3;
  RandCaseStatementSyntax *pRVar1;
  DeepCloneVisitor visitor;
  Token local_58;
  NamedLabelSyntax *local_48;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_48 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_48 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::RandCaseItemSyntax>
                     ((SyntaxList<slang::syntax::RandCaseItemSyntax> *)(__fn + 0x68),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandCaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::RandCaseItemSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_48,args_1,&local_58,args_3,&local_40);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandCaseStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandCaseStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.randCase.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endCase.deepClone(alloc)
    );
}